

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderTextureSizeTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::ShaderTextureSizeTests::init
          (ShaderTextureSizeTests *this,EVP_PKEY_CTX *ctx)

{
  TextureType TVar1;
  int iVar2;
  char *__rhs;
  TestNode *this_00;
  TestCase *this_01;
  long lVar3;
  int *value;
  long lVar4;
  string desc;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  long local_108;
  TestNode *local_100;
  long local_f8;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  lVar3 = 0;
  local_100 = (TestNode *)this;
  while (lVar3 != 6) {
    lVar4 = 0;
    local_108 = lVar3;
    while( true ) {
      if (lVar4 == 8) break;
      local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
      local_128._M_string_length = 0;
      local_128.field_2._M_local_buf[0] = '\0';
      std::operator+(&local_b0,&local_128,"samples_");
      value = (int *)((long)init::sampleCounts + lVar4);
      local_f8 = lVar4;
      de::toString<int>(&local_f0,value);
      std::operator+(&local_90,&local_b0,&local_f0);
      std::operator+(&local_d0,&local_90,"_");
      __rhs = init::samplerTypes[lVar3].name;
      std::operator+(&local_70,&local_d0,__rhs);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_128);
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      local_f0._M_string_length = 0;
      local_f0.field_2._M_local_buf[0] = '\0';
      std::operator+(&local_128,&local_f0,"samples count = ");
      de::toString<int>(&local_50,value);
      std::operator+(&local_b0,&local_128,&local_50);
      std::operator+(&local_90,&local_b0,", type = ");
      std::operator+(&local_d0,&local_90,__rhs);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_128);
      std::__cxx11::string::~string((string *)&local_f0);
      this_01 = (TestCase *)operator_new(0xb8);
      this_00 = local_100;
      TVar1 = init::samplerTypes[lVar3].type;
      iVar2 = *value;
      TestCase::TestCase(this_01,(Context *)local_100[1]._vptr_TestNode,local_70._M_dataplus._M_p,
                         local_d0._M_dataplus._M_p);
      (this_01->super_TestCase).super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TextureSizeCase_00a10058;
      *(TextureType *)&this_01[1].super_TestCase.super_TestNode._vptr_TestNode = TVar1;
      *(int *)((long)&this_01[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = iVar2;
      *(bool *)&this_01[1].super_TestCase.super_TestNode.m_testCtx =
           (TVar1 | TEXTURE_INT_2D) == TEXTURE_INT_2D_ARRAY || TVar1 == TEXTURE_UINT_2D_ARRAY;
      *(undefined8 *)((long)&this_01[1].super_TestCase.super_TestNode.m_testCtx + 4) = 0;
      this_01[1].super_TestCase.super_TestNode.m_name._M_string_length = 0;
      this_01[1].super_TestCase.super_TestNode.m_name.field_2._M_allocated_capacity = 0;
      *(undefined8 *)((long)&this_01[1].super_TestCase.super_TestNode.m_name.field_2 + 8) = 0;
      this_01[1].super_TestCase.super_TestNode.m_description._M_dataplus._M_p = (pointer)0x0;
      *(undefined4 *)&this_01[1].super_TestCase.super_TestNode.m_description._M_string_length = 0;
      *(undefined2 *)
       ((long)&this_01[1].super_TestCase.super_TestNode.m_description._M_string_length + 4) = 0x101;
      tcu::TestNode::addChild(this_00,(TestNode *)this_01);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_70);
      lVar4 = local_f8 + 4;
    }
    lVar3 = local_108 + 1;
  }
  return 6;
}

Assistant:

void ShaderTextureSizeTests::init (void)
{
	static const struct SamplerType
	{
		TextureSizeCase::TextureType	type;
		const char*						name;
	} samplerTypes[] =
	{
		{ TextureSizeCase::TEXTURE_FLOAT_2D,		"texture_2d"			},
		{ TextureSizeCase::TEXTURE_FLOAT_2D_ARRAY,	"texture_2d_array"		},
		{ TextureSizeCase::TEXTURE_INT_2D,			"texture_int_2d"		},
		{ TextureSizeCase::TEXTURE_INT_2D_ARRAY,	"texture_int_2d_array"	},
		{ TextureSizeCase::TEXTURE_UINT_2D,			"texture_uint_2d"		},
		{ TextureSizeCase::TEXTURE_UINT_2D_ARRAY,	"texture_uint_2d_array"	},
	};

	static const int sampleCounts[] = { 1, 4 };

	for (int samplerTypeNdx = 0; samplerTypeNdx < DE_LENGTH_OF_ARRAY(samplerTypes); ++samplerTypeNdx)
	{
		for (int sampleCountNdx = 0; sampleCountNdx < DE_LENGTH_OF_ARRAY(sampleCounts); ++sampleCountNdx)
		{
			const std::string name = std::string() + "samples_" + de::toString(sampleCounts[sampleCountNdx]) + "_" + samplerTypes[samplerTypeNdx].name;
			const std::string desc = std::string() + "samples count = " + de::toString(sampleCounts[sampleCountNdx]) + ", type = " + samplerTypes[samplerTypeNdx].name;

			addChild(new TextureSizeCase(m_context, name.c_str(), desc.c_str(), samplerTypes[samplerTypeNdx].type, sampleCounts[sampleCountNdx]));
		}
	}
}